

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_mdtm_resp(Curl_easy *data,int ftpcode)

{
  undefined1 *puVar1;
  curl_TimeCond cVar2;
  FILEPROTO *pFVar3;
  connectdata *pcVar4;
  ulong uVar5;
  ulong uVar6;
  long intime;
  bool bVar7;
  int iVar8;
  uint uVar9;
  CURLcode CVar10;
  time_t tVar11;
  char *fmt;
  int second;
  int minute;
  int hour;
  int day;
  int month;
  int year;
  tm buffer;
  char timebuf [24];
  
  pFVar3 = (data->req).p.file;
  if (ftpcode == 0x226) {
    bVar7 = false;
    Curl_failf(data,"Given file does not exist");
    CVar10 = CURLE_REMOTE_FILE_NOT_FOUND;
  }
  else {
    if (ftpcode == 0xd5) {
      pcVar4 = data->conn;
      iVar8 = __isoc99_sscanf((data->state).buffer + 4,"%04d%02d%02d%02d%02d%02d",&year,&month,&day,
                              &hour,&minute,&second);
      if (iVar8 == 6) {
        curl_msnprintf(timebuf,0x18,"%04d%02d%02d %02d:%02d:%02d GMT",(ulong)(uint)year,
                       (ulong)(uint)month,(ulong)(uint)day,(ulong)(uint)hour,(ulong)(uint)minute,
                       (ulong)(uint)second);
        tVar11 = Curl_getdate_capped(timebuf);
        (data->info).filetime = tVar11;
      }
      uVar9 = (uint)*(undefined8 *)&(data->set).field_0x9a0;
      if (((((uVar9 >> 0x1c & 1) != 0) && ((uVar9 >> 9 & 1) != 0)) &&
          ((pcVar4->proto).ftpc.file != (char *)0x0)) &&
         (intime = (data->info).filetime, -1 < intime)) {
        CVar10 = Curl_gmtime(intime,&buffer);
        if (CVar10 != CURLE_OK) {
          return CVar10;
        }
        iVar8 = 6;
        if (buffer.tm_wday != 0) {
          iVar8 = buffer.tm_wday + -1;
        }
        iVar8 = curl_msnprintf(timebuf,0x80,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                               Curl_wkday[iVar8],(ulong)(uint)buffer.tm_mday,
                               Curl_month[buffer.tm_mon],(ulong)(buffer.tm_year + 0x76c),
                               (ulong)(uint)buffer.tm_hour,(ulong)(uint)buffer.tm_min,
                               (ulong)(uint)buffer.tm_sec);
        CVar10 = Curl_client_write(data,3,timebuf,(long)iVar8);
        if (CVar10 != CURLE_OK) {
          return CVar10;
        }
      }
    }
    else {
      Curl_infof(data,"unsupported MDTM reply format");
    }
    CVar10 = CURLE_OK;
    bVar7 = true;
  }
  cVar2 = (data->set).timecondition;
  if (cVar2 != CURL_TIMECOND_NONE) {
    uVar5 = (data->info).filetime;
    if (((long)uVar5 < 1) || (uVar6 = (data->set).timevalue, (long)uVar6 < 1)) {
      Curl_infof(data,"Skipping time comparison");
    }
    else if (cVar2 == CURL_TIMECOND_IFUNMODSINCE) {
      if (uVar6 < uVar5) {
        fmt = "The requested document is not old enough";
LAB_0011baca:
        Curl_infof(data,fmt);
        pFVar3->fd = 2;
        puVar1 = &(data->info).field_0xe4;
        *puVar1 = *puVar1 | 1;
        (data->conn->proto).ftpc.state = FTP_STOP;
        return CURLE_OK;
      }
    }
    else if (uVar5 <= uVar6) {
      fmt = "The requested document is not new enough";
      goto LAB_0011baca;
    }
  }
  if (bVar7) {
    CVar10 = ftp_state_type(data);
  }
  return CVar10;
}

Assistant:

static CURLcode ftp_state_mdtm_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  switch(ftpcode) {
  case 213:
    {
      /* we got a time. Format should be: "YYYYMMDDHHMMSS[.sss]" where the
         last .sss part is optional and means fractions of a second */
      int year, month, day, hour, minute, second;
      if(6 == sscanf(&data->state.buffer[4], "%04d%02d%02d%02d%02d%02d",
                     &year, &month, &day, &hour, &minute, &second)) {
        /* we have a time, reformat it */
        char timebuf[24];
        msnprintf(timebuf, sizeof(timebuf),
                  "%04d%02d%02d %02d:%02d:%02d GMT",
                  year, month, day, hour, minute, second);
        /* now, convert this into a time() value: */
        data->info.filetime = Curl_getdate_capped(timebuf);
      }

#ifdef CURL_FTP_HTTPSTYLE_HEAD
      /* If we asked for a time of the file and we actually got one as well,
         we "emulate" a HTTP-style header in our output. */

      if(data->set.opt_no_body &&
         ftpc->file &&
         data->set.get_filetime &&
         (data->info.filetime >= 0) ) {
        char headerbuf[128];
        int headerbuflen;
        time_t filetime = data->info.filetime;
        struct tm buffer;
        const struct tm *tm = &buffer;

        result = Curl_gmtime(filetime, &buffer);
        if(result)
          return result;

        /* format: "Tue, 15 Nov 1994 12:45:26" */
        headerbuflen = msnprintf(headerbuf, sizeof(headerbuf),
                  "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                  Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
                  tm->tm_mday,
                  Curl_month[tm->tm_mon],
                  tm->tm_year + 1900,
                  tm->tm_hour,
                  tm->tm_min,
                  tm->tm_sec);
        result = Curl_client_write(data, CLIENTWRITE_BOTH, headerbuf,
                                   headerbuflen);
        if(result)
          return result;
      } /* end of a ridiculous amount of conditionals */
#endif
    }
    break;
  default:
    infof(data, "unsupported MDTM reply format");
    break;
  case 550: /* "No such file or directory" */
    failf(data, "Given file does not exist");
    result = CURLE_REMOTE_FILE_NOT_FOUND;
    break;
  }

  if(data->set.timecondition) {
    if((data->info.filetime > 0) && (data->set.timevalue > 0)) {
      switch(data->set.timecondition) {
      case CURL_TIMECOND_IFMODSINCE:
      default:
        if(data->info.filetime <= data->set.timevalue) {
          infof(data, "The requested document is not new enough");
          ftp->transfer = PPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          state(data, FTP_STOP);
          return CURLE_OK;
        }
        break;
      case CURL_TIMECOND_IFUNMODSINCE:
        if(data->info.filetime > data->set.timevalue) {
          infof(data, "The requested document is not old enough");
          ftp->transfer = PPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          state(data, FTP_STOP);
          return CURLE_OK;
        }
        break;
      } /* switch */
    }
    else {
      infof(data, "Skipping time comparison");
    }
  }

  if(!result)
    result = ftp_state_type(data);

  return result;
}